

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFilterContains.cpp
# Opt level: O1

bool __thiscall
liblogger::LogFilterContains::Filter(LogFilterContains *this,LogType Type,string *str)

{
  char *__s1;
  int iVar1;
  long lVar2;
  
  __s1 = (this->m_match)._M_dataplus._M_p;
  if (this->m_case == false) {
    iVar1 = strcasecmp(__s1,(str->_M_dataplus)._M_p);
    if (iVar1 == 0) {
      return true;
    }
  }
  else {
    lVar2 = std::__cxx11::string::find((char *)str,(ulong)__s1,0);
    if (lVar2 != -1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool LogFilterContains::Filter(const LogType Type, const std::string &str)
{
	if (m_case == false)
	{
		if (strcasecmp(m_match.c_str(), str.c_str()) == 0)
		{
			return true;
		}
	}
	else
	{
		if (str.find(m_match) != std::string::npos)
		{
			return true;
		}
	}

	return false;
}